

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Vec_Ptr_t * Bac_NtkTransformToPtrInputs(Bac_Ntk_t *p)

{
  int i;
  Vec_Ptr_t *vArray;
  char *Entry;
  int i_00;
  
  vArray = Vec_PtrAllocExact((p->vInputs).nSize);
  for (i_00 = 0; i_00 < (p->vInputs).nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(&p->vInputs,i_00);
    Entry = Bac_ObjNameStr(p,i);
    Vec_PtrPush(vArray,Entry);
  }
  Ptr_CheckArray(vArray);
  return vArray;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrInputs( Bac_Ntk_t * p )
{
    int i, iTerm;
    Vec_Ptr_t * vSigs = Vec_PtrAllocExact( Bac_NtkPiNum(p) );
    Bac_NtkForEachPi( p, iTerm, i )
        Vec_PtrPush( vSigs, Bac_ObjNameStr(p, iTerm) );
    assert( Ptr_CheckArray(vSigs) );
    return vSigs;
}